

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreateTarget(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,Vec_Int_t *vValues)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  long lVar7;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x480,"Abc_Ntk_t *Abc_NtkCreateTarget(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar2;
  __ptr = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar7 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar3->pArray[lVar7];
      pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
      (pAVar5->field_6).pCopy = pAVar4;
      pcVar2 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
      lVar7 = lVar7 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar7 < pVVar3->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar7 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)__ptr->pArray[lVar7];
      pAVar4 = Abc_NodeStrash(pNtk_00,pAVar5,0);
      (pAVar5->field_6).pCopy = pAVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pAVar5 = Abc_AigConst1(pNtk_00);
  if (0 < vRoots->nSize) {
    lVar7 = 0;
    do {
      plVar6 = (long *)vRoots->pArray[lVar7];
      if (0xfffffffd < (*(uint *)((long)plVar6 + 0x14) & 0xf) - 5) {
        plVar6 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
      }
      if (vValues->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pAVar4 = (Abc_Obj_t *)((ulong)plVar6[8] ^ 1);
      if (vValues->pArray[lVar7] != 0) {
        pAVar4 = (Abc_Obj_t *)plVar6[8];
      }
      pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vRoots->nSize);
  }
  pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar4,pAVar5);
  Abc_ObjAssignName(pAVar4,"miter",(char *)0x0);
  iVar1 = Abc_NtkCheck(pNtk_00);
  if (iVar1 == 0) {
    fwrite("Abc_NtkCreateTarget(): Network check has failed.\n",0x31,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateTarget( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, Vec_Int_t * vValues )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFinal, * pOther, * pNodePo;
    int i;

    assert( Abc_NtkIsLogic(pNtk) );
    
    // start the network
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);

    // collect the nodes in the TFI of the output
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)vRoots->pArray, vRoots->nSize );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_NodeStrash( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );

    // add the PO
    pFinal = Abc_AigConst1( pNtkNew );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) )
            pOther = Abc_ObjFanin0(pObj)->pCopy;
        else
            pOther = pObj->pCopy;
        if ( Vec_IntEntry(vValues, i) == 0 )
            pOther = Abc_ObjNot(pOther);
        pFinal = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pFinal, pOther );
    }

    // add the PO corresponding to this output
    pNodePo = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAddFanin( pNodePo, pFinal );
    Abc_ObjAssignName( pNodePo, "miter", NULL );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateTarget(): Network check has failed.\n" );
    return pNtkNew;
}